

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ExtractSubrangeInternal
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int start,int num,long elements)

{
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  Arena *pAVar4;
  Type *pTVar5;
  string *to;
  int local_10c;
  int i_1;
  Type *new_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *element;
  int i;
  LogFinisher local_b2;
  byte local_b1;
  LogMessage local_b0;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  long local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements_local;
  int num_local;
  int start_local;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_61 = 0;
  local_28 = elements;
  elements_local._0_4_ = num;
  elements_local._4_4_ = start;
  _num_local = this;
  if (start < 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x7ad);
    local_61 = 1;
    pLVar3 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (start) >= (0): ");
    internal::LogFinisher::operator=(local_75,pLVar3);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  local_b1 = 0;
  if ((int)elements_local < 0) {
    internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x7ae);
    local_b1 = 1;
    pLVar3 = internal::LogMessage::operator<<(&local_b0,"CHECK failed: (num) >= (0): ");
    internal::LogFinisher::operator=(&local_b2,pLVar3);
  }
  if ((local_b1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_b0);
  }
  iVar1 = elements_local._4_4_ + (int)elements_local;
  iVar2 = size(this);
  element._7_1_ = 0;
  if (iVar2 < iVar1) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&i,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x7af);
    element._7_1_ = 1;
    pLVar3 = internal::LogMessage::operator<<
                       ((LogMessage *)&i,"CHECK failed: (start + num) <= (size()): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&element + 6),pLVar3);
  }
  if ((element._7_1_ & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)&i);
  }
  if (0 < (int)elements_local) {
    if (local_28 != 0) {
      pAVar4 = GetArenaNoVirtual(this);
      if (pAVar4 == (Arena *)0x0) {
        for (local_10c = 0; local_10c < (int)elements_local; local_10c = local_10c + 1) {
          pTVar5 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this->super_RepeatedPtrFieldBase,local_10c + elements_local._4_4_);
          *(Type **)(local_28 + (long)local_10c * 8) = pTVar5;
        }
      }
      else {
        for (element._0_4_ = 0; (int)element < (int)elements_local; element._0_4_ = (int)element + 1
            ) {
          pTVar5 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this->super_RepeatedPtrFieldBase,(int)element + elements_local._4_4_)
          ;
          to = internal::StringTypeHandler::NewFromPrototype(pTVar5,(Arena *)0x0);
          internal::StringTypeHandler::Merge(pTVar5,to);
          *(string **)(local_28 + (long)(int)element * 8) = to;
        }
      }
    }
    internal::RepeatedPtrFieldBase::CloseGap
              (&this->super_RepeatedPtrFieldBase,elements_local._4_4_,(int)elements_local);
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrangeInternal(
    int start, int num, Element** elements, google::protobuf::internal::true_type) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != NULL) {
      if (GetArenaNoVirtual() != NULL) {
        // If we're on an arena, we perform a copy for each element so that the
        // returned elements are heap-allocated.
        for (int i = 0; i < num; ++i) {
          Element* element = RepeatedPtrFieldBase::
              Mutable<TypeHandler>(i + start);
          typename TypeHandler::Type* new_value =
              TypeHandler::NewFromPrototype(element, NULL);
          TypeHandler::Merge(*element, new_value);
          elements[i] = new_value;
        }
      } else {
        for (int i = 0; i < num; ++i) {
          elements[i] = RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
        }
      }
    }
    CloseGap(start, num);
  }
}